

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O1

void __thiscall StackTrace::clean(StackTrace *this)

{
  return;
}

Assistant:

void StackTrace::clean() {
// currently disabled as way to expensive
// and does not work with vector-lists
#if 0
    bool delete_flag, sth_was_deleted;
    do {
        sth_was_deleted = false;

        for (auto it = _local_stack.m_vertices.begin(); it != _local_stack.m_vertices.end(); it++) {
            //if and only if the vertex is not  the current element, and it has no in_edges must be a top of stack
            if (*it != _ce && boost::in_degree(*it, _local_stack) == 0) {
                delete_flag = true;
                for (auto jt = _read_write.begin(); jt != _read_write.end(); jt++) {//step through the read_write list to make sure no element is refering to it
                    if (jt->second.second == *it) {
                        delete_flag = false;
                        break;
                    }
                }
                if (delete_flag) {
                    boost::clear_vertex(*it, _local_stack);
                    boost::remove_vertex(*it, _local_stack);
                    sth_was_deleted = true;
                    break;
                }
            }
        }
    } while (sth_was_deleted);
#endif
}